

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sphere.cpp
# Opt level: O0

ON_BoundingBox * __thiscall
ON_Sphere::BoundingBox(ON_BoundingBox *__return_storage_ptr__,ON_Sphere *this)

{
  ON_BoundingBox *bbox;
  ON_3dPoint local_30;
  double local_18;
  double r;
  ON_Sphere *this_local;
  
  r = (double)this;
  ON_BoundingBox::ON_BoundingBox(__return_storage_ptr__);
  local_18 = Radius(this);
  Center(&local_30,this);
  (__return_storage_ptr__->m_min).x = local_30.x;
  (__return_storage_ptr__->m_min).y = local_30.y;
  (__return_storage_ptr__->m_min).z = local_30.z;
  (__return_storage_ptr__->m_max).x = (__return_storage_ptr__->m_min).x;
  (__return_storage_ptr__->m_max).y = (__return_storage_ptr__->m_min).y;
  (__return_storage_ptr__->m_max).z = (__return_storage_ptr__->m_min).z;
  (__return_storage_ptr__->m_min).x = (__return_storage_ptr__->m_min).x - local_18;
  (__return_storage_ptr__->m_min).y = (__return_storage_ptr__->m_min).y - local_18;
  (__return_storage_ptr__->m_min).z = (__return_storage_ptr__->m_min).z - local_18;
  (__return_storage_ptr__->m_max).x = local_18 + (__return_storage_ptr__->m_max).x;
  (__return_storage_ptr__->m_max).y = local_18 + (__return_storage_ptr__->m_max).y;
  (__return_storage_ptr__->m_max).z = local_18 + (__return_storage_ptr__->m_max).z;
  return __return_storage_ptr__;
}

Assistant:

ON_BoundingBox ON_Sphere::BoundingBox() const
{
  ON_BoundingBox bbox;
  double r = Radius();
  bbox.m_min = Center();
  bbox.m_max = bbox.m_min;
  bbox.m_min.x -= r;
  bbox.m_min.y -= r;
  bbox.m_min.z -= r;
  bbox.m_max.x += r;
  bbox.m_max.y += r;
  bbox.m_max.z += r;
  return bbox;
}